

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O2

int xmlTextWriterStartElementNS
              (xmlTextWriterPtr writer,xmlChar *prefix,xmlChar *name,xmlChar *namespaceURI)

{
  int iVar1;
  int iVar2;
  xmlChar *pxVar3;
  undefined8 *data;
  xmlLinkPtr pxVar4;
  int iVar5;
  
  iVar1 = -1;
  iVar5 = iVar1;
  if ((name != (xmlChar *)0x0 && writer != (xmlTextWriterPtr)0x0) && (*name != '\0')) {
    if (prefix == (xmlChar *)0x0) {
      pxVar3 = (xmlChar *)0x0;
    }
    else {
      pxVar3 = xmlStrdup(prefix);
      pxVar3 = xmlStrcat(pxVar3,":");
    }
    pxVar3 = xmlStrcat(pxVar3,name);
    iVar2 = xmlTextWriterStartElement(writer,pxVar3);
    (*xmlFree)(pxVar3);
    if ((-1 < iVar2) && (iVar5 = iVar2, namespaceURI != (xmlChar *)0x0)) {
      data = (undefined8 *)(*xmlMalloc)(0x18);
      if (data == (undefined8 *)0x0) {
        xmlWriterErrMsg(writer,XML_ERR_NO_MEMORY,"xmlTextWriterStartElementNS : out of memory!\n");
        iVar5 = iVar1;
      }
      else {
        pxVar3 = xmlStrdup("xmlns");
        if (prefix != (xmlChar *)0x0) {
          pxVar3 = xmlStrcat(pxVar3,":");
          pxVar3 = xmlStrcat(pxVar3,prefix);
        }
        *data = pxVar3;
        pxVar3 = xmlStrdup(namespaceURI);
        data[1] = pxVar3;
        if (pxVar3 == (xmlChar *)0x0) {
          xmlWriterErrMsg(writer,XML_ERR_NO_MEMORY,"xmlTextWriterStartElementNS : out of memory!\n")
          ;
          (*xmlFree)(data);
          iVar5 = iVar1;
        }
        else {
          pxVar4 = xmlListFront(writer->nodes);
          data[2] = pxVar4;
          xmlListPushFront(writer->nsstack,data);
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int
xmlTextWriterStartElementNS(xmlTextWriterPtr writer,
                            const xmlChar * prefix, const xmlChar * name,
                            const xmlChar * namespaceURI)
{
    int count;
    int sum;
    xmlChar *buf;

    if ((writer == NULL) || (name == NULL) || (*name == '\0'))
        return -1;

    buf = NULL;
    if (prefix != 0) {
        buf = xmlStrdup(prefix);
        buf = xmlStrcat(buf, BAD_CAST ":");
    }
    buf = xmlStrcat(buf, name);

    sum = 0;
    count = xmlTextWriterStartElement(writer, buf);
    xmlFree(buf);
    if (count < 0)
        return -1;
    sum += count;

    if (namespaceURI != 0) {
        xmlTextWriterNsStackEntry *p = (xmlTextWriterNsStackEntry *)
        xmlMalloc(sizeof(xmlTextWriterNsStackEntry));
        if (p == 0) {
            xmlWriterErrMsg(writer, XML_ERR_NO_MEMORY,
                            "xmlTextWriterStartElementNS : out of memory!\n");
            return -1;
        }

        buf = xmlStrdup(BAD_CAST "xmlns");
        if (prefix != 0) {
            buf = xmlStrcat(buf, BAD_CAST ":");
            buf = xmlStrcat(buf, prefix);
        }

        p->prefix = buf;
        p->uri = xmlStrdup(namespaceURI);
        if (p->uri == 0) {
            xmlWriterErrMsg(writer, XML_ERR_NO_MEMORY,
                            "xmlTextWriterStartElementNS : out of memory!\n");
            xmlFree(p);
            return -1;
        }
        p->elem = xmlListFront(writer->nodes);

        xmlListPushFront(writer->nsstack, p);
    }

    return sum;
}